

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void __thiscall higan::HttpServer::OnNewConnection(HttpServer *this,TcpConnectionPtr *connection)

{
  TcpConnection *pTVar1;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  string local_58;
  any local_38;
  
  pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"HttpContext","");
  HttpContext::HttpContext((HttpContext *)&local_e8);
  local_38._M_manager = std::any::_Manager_external<higan::HttpContext>::_S_manage;
  local_38._M_storage._M_ptr = (void *)0x0;
  std::any::_Manager_external<higan::HttpContext>::_S_create<higan::HttpContext>
            (&local_38._M_storage,(HttpContext *)&local_e8);
  TcpConnection::SetContext(pTVar1,&local_58,&local_38);
  if (local_38._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_38._M_manager)(_Op_destroy,&local_38,(_Arg *)0x0);
    local_38._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  HttpContext::~HttpContext((HttpContext *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_e8._8_8_ = 0;
  local_e8._M_unused._M_object = operator_new(0x18);
  *(code **)local_e8._M_unused._0_8_ = OnMessageSendOver;
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = 0;
  *(HttpServer **)((long)local_e8._M_unused._0_8_ + 0x10) = this;
  local_d0 = std::
             _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&),_std::_Bind<void_(higan::HttpServer::*(higan::HttpServer_*,_std::_Placeholder<1>))(const_std::shared_ptr<higan::TcpConnection>_&)>_>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&),_std::_Bind<void_(higan::HttpServer::*(higan::HttpServer_*,_std::_Placeholder<1>))(const_std::shared_ptr<higan::TcpConnection>_&)>_>
             ::_M_manager;
  TcpConnection::SetWriteOverCallback(pTVar1,(TcpConnectionCallback *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  return;
}

Assistant:

void HttpServer::OnNewConnection(const TcpConnectionPtr& connection)
{
	connection->SetContext("HttpContext", HttpContext());
	connection->SetWriteOverCallback(std::bind(&HttpServer::OnMessageSendOver, this, _1));
}